

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O3

void lj_tab_free(global_State *g,GCtab *t)

{
  void *pvVar1;
  ulong uVar2;
  size_t sVar3;
  
  if (t->hmask != 0) {
    pvVar1 = (void *)(t->node).ptr64;
    uVar2 = (ulong)(t->hmask + 1);
    (g->gc).total = (g->gc).total + uVar2 * -0x18;
    (*g->allocf)(g->allocd,pvVar1,uVar2 * 0x18,0);
  }
  uVar2 = (ulong)t->asize;
  if ((uVar2 != 0) && (t->colo < '\x01')) {
    pvVar1 = (void *)(t->array).ptr64;
    (g->gc).total = (g->gc).total + uVar2 * -8;
    (*g->allocf)(g->allocd,pvVar1,uVar2 * 8,0);
  }
  if (t->colo == 0) {
    (g->gc).total = (g->gc).total - 0x40;
    sVar3 = 0x40;
  }
  else {
    sVar3 = (ulong)((byte)t->colo & 0x7f) * 8 + 0x40;
    (g->gc).total = (g->gc).total - sVar3;
  }
  (*g->allocf)(g->allocd,t,sVar3,0);
  return;
}

Assistant:

void LJ_FASTCALL lj_tab_free(global_State *g, GCtab *t)
{
  if (t->hmask > 0)
    lj_mem_freevec(g, noderef(t->node), t->hmask+1, Node);
  if (t->asize > 0 && LJ_MAX_COLOSIZE != 0 && t->colo <= 0)
    lj_mem_freevec(g, tvref(t->array), t->asize, TValue);
  if (LJ_MAX_COLOSIZE != 0 && t->colo)
    lj_mem_free(g, t, sizetabcolo((uint32_t)t->colo & 0x7f));
  else
    lj_mem_freet(g, t);
}